

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

int luaD_precall(lua_State *L,StkId func,int nresults,int op_call)

{
  Proto *p_00;
  StkId pTVar1;
  bool bVar2;
  ushort uVar3;
  int nres;
  uint n_00;
  int iVar4;
  CallInfo *local_c8;
  CallInfo *local_c0;
  ptrdiff_t t___2;
  TValue *io;
  _func_double_double *f_1;
  double v;
  double arg;
  TValue *arg1;
  int sig;
  int tt;
  int nargs;
  int b;
  ravi_compile_options_t options;
  ptrdiff_t t___1;
  int fsize;
  int n_1;
  Proto *p;
  StkId base;
  ptrdiff_t t__;
  int n;
  CallInfo *ci;
  lua_CFunction f;
  int op_call_local;
  int nresults_local;
  StkId func_local;
  lua_State *L_local;
  
  uVar3 = func->tt_ & 0x7f;
  _op_call_local = func;
  if (uVar3 == 6) {
    if (func->tt_ != 0x8006) {
      __assert_fail("((((func))->tt_) == (((((6) | ((0) << 4))) | (1 << 15))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                    ,0x1cd,"int luaD_precall(lua_State *, StkId, int, int)");
    }
    if (((func->value_).gc)->tt != '\x06') {
      __assert_fail("(((func)->value_).gc)->tt == ((6) | ((0) << 4))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                    ,0x1cd,"int luaD_precall(lua_State *, StkId, int, int)");
    }
    p_00 = *(Proto **)((func->value_).f + 0x18);
    t___1._4_4_ = (int)((long)L->top - (long)func >> 4) + -1;
    n_00 = (uint)p_00->maxstacksize;
    if ((long)L->stack_last - (long)L->top >> 4 <= (long)(int)n_00) {
      options = (ravi_compile_options_t)((long)func - (long)L->stack);
      if (0 < L->l_G->GCdebt) {
        luaC_step(L);
      }
      luaD_growstack(L,n_00);
      _op_call_local = (StkId)((long)&L->stack->value_ + (long)options);
    }
    if (p_00->is_vararg == '\0') {
      for (; t___1._4_4_ < (int)(uint)p_00->numparams; t___1._4_4_ = t___1._4_4_ + 1) {
        pTVar1 = L->top;
        L->top = pTVar1 + 1;
        pTVar1->tt_ = 0;
      }
      p = (Proto *)(_op_call_local + 1);
    }
    else {
      p = (Proto *)adjust_varargs(L,p_00,t___1._4_4_);
    }
    if (L->ci->next == (CallInfo *)0x0) {
      local_c8 = luaE_extendCI(L);
    }
    else {
      local_c8 = L->ci->next;
    }
    L->ci = local_c8;
    local_c8->nresults = (short)nresults;
    local_c8->func = _op_call_local;
    (local_c8->u).l.base = (StkId)p;
    local_c8->top = (StkId)(&p->next + (long)(int)n_00 * 2);
    L->top = (StkId)(&p->next + (long)(int)n_00 * 2);
    if (L->stack_last < local_c8->top) {
      __assert_fail("ci->top <= L->stack_last",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                    ,0x1dd,"int luaD_precall(lua_State *, StkId, int, int)");
    }
    (local_c8->u).l.savedpc = p_00->code;
    local_c8->callstatus = 2;
    local_c8->jitstatus = '\0';
    if ((L->hookmask & 1) != 0) {
      callhook(L,local_c8);
    }
    if ((L == L->l_G->mainthread) && ((p_00->ravi_jit).jit_status == '\0')) {
      memset(&nargs,0,8);
      raviV_compile(L,p_00,(ravi_compile_options_t *)&nargs);
    }
    if ((L != L->l_G->mainthread) || ((p_00->ravi_jit).jit_function == (lua_CFunction)0x0)) {
      return 0;
    }
    local_c8->jitstatus = '\x01';
    (local_c8->u).l.savedpc = (Instruction *)((local_c8->u).c.old_errfunc + 4);
    uVar3 = L->nCcalls + 1;
    L->nCcalls = uVar3;
    if (0x7c < uVar3) {
      if (L->nCcalls == 0x7d) {
        luaG_runerror(L,"stack overflow");
      }
      if (0x8b < L->nCcalls) {
        luaD_throw(L,6);
      }
    }
    L->nny = L->nny + 1;
    iVar4 = (*(p_00->ravi_jit).jit_function)(L);
    L->nny = L->nny - 1;
    L->nCcalls = L->nCcalls - 1;
    if ((op_call != 0) && (iVar4 != 0)) {
      if ((L->ci->callstatus & 2) == 0) {
        __assert_fail("((L->ci)->callstatus & (1<<1))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                      ,0x205,"int luaD_precall(lua_State *, StkId, int, int)");
      }
      L->top = L->ci->top;
    }
    return 2;
  }
  if (uVar3 == 0x16) {
    if (func->tt_ != 0x16) {
      __assert_fail("((((func))->tt_) == (((6) | ((1) << 4))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                    ,0x1b7,"int luaD_precall(lua_State *, StkId, int, int)");
    }
    ci = (CallInfo *)(func->value_).gc;
  }
  else {
    if (uVar3 != 0x26) {
      if (uVar3 != 0x46) {
        if ((long)L->stack_last - (long)L->top >> 4 < 2) {
          pTVar1 = L->stack;
          if (0 < L->l_G->GCdebt) {
            luaC_step(L);
          }
          luaD_growstack(L,1);
          _op_call_local = (StkId)((long)L->stack + ((long)func - (long)pTVar1));
        }
        tryfuncTM(L,_op_call_local);
        iVar4 = luaD_precall(L,_op_call_local,nresults,op_call);
        return iVar4;
      }
      iVar4 = (int)(uint)func->tt_ >> 8;
      if ((iVar4 - 1U < 3) && ((int)((ulong)((long)L->top - (long)func) >> 4) == 2)) {
        bVar2 = true;
        if (func[1].tt_ == 3) {
          if (func[1].tt_ != 3) {
            __assert_fail("((((arg1))->tt_) == (((3) | ((0) << 4))))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                          ,0x21e,"int luaD_precall(lua_State *, StkId, int, int)");
          }
          v = func[1].value_.n;
        }
        else if (func[1].tt_ == 0x13) {
          if (func[1].tt_ != 0x13) {
            __assert_fail("((((arg1))->tt_) == (((3) | ((1) << 4))))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                          ,0x220,"int luaD_precall(lua_State *, StkId, int, int)");
          }
          v = (double)func[1].value_.i;
        }
        else {
          bVar2 = false;
        }
        if (bVar2) {
          if (iVar4 == 1) {
            f_1 = (_func_double_double *)exp(v);
          }
          else if (iVar4 == 2) {
            f_1 = (_func_double_double *)log(v);
          }
          else {
            if ((func->tt_ & 0x7f) != 0x46) {
              __assert_fail("((((func)->tt_) & 0x7F) == ((6) | ((4) << 4)))",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                            ,0x229,"int luaD_precall(lua_State *, StkId, int, int)");
            }
            (*(func->value_).f)(L);
            f_1 = (_func_double_double *)v;
          }
          (func->value_).f = (lua_CFunction)f_1;
          func->tt_ = 3;
          L->top = func + 1;
          return 1;
        }
      }
      luaG_runerror(L,"Unsupported fastcall to C function");
    }
    if (func->tt_ != 0x8026) {
      __assert_fail("((((func))->tt_) == (((((6) | ((2) << 4))) | (1 << 15))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                    ,0x1b4,"int luaD_precall(lua_State *, StkId, int, int)");
    }
    if (((func->value_).gc)->tt != '&') {
      __assert_fail("(((func)->value_).gc)->tt == ((6) | ((2) << 4))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                    ,0x1b4,"int luaD_precall(lua_State *, StkId, int, int)");
    }
    ci = *(CallInfo **)((func->value_).f + 0x18);
  }
  if ((long)L->stack_last - (long)L->top >> 4 < 0x15) {
    pTVar1 = L->stack;
    if (0 < L->l_G->GCdebt) {
      luaC_step(L);
    }
    luaD_growstack(L,0x14);
    _op_call_local = (StkId)((long)L->stack + ((long)func - (long)pTVar1));
  }
  if (L->ci->next == (CallInfo *)0x0) {
    local_c0 = luaE_extendCI(L);
  }
  else {
    local_c0 = L->ci->next;
  }
  L->ci = local_c0;
  local_c0->nresults = (short)nresults;
  local_c0->func = _op_call_local;
  local_c0->top = L->top + 0x14;
  if (L->stack_last < local_c0->top) {
    __assert_fail("ci->top <= L->stack_last",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                  ,0x1bf,"int luaD_precall(lua_State *, StkId, int, int)");
  }
  local_c0->callstatus = 0;
  local_c0->jitstatus = '\0';
  if ((L->hookmask & 1) != 0) {
    luaD_hook(L,0,-1);
  }
  iVar4 = **(int **)&L[-1].hookmask + -1;
  **(int **)&L[-1].hookmask = iVar4;
  if (iVar4 != 0) {
    __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                  ,0x1c4,"int luaD_precall(lua_State *, StkId, int, int)");
  }
  nres = (*(code *)ci)(L);
  iVar4 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar4 + 1;
  if (iVar4 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                  ,0x1c6,"int luaD_precall(lua_State *, StkId, int, int)");
  }
  if ((long)nres < (long)L->top - (long)L->ci->func >> 4) {
    luaD_poscall(L,local_c0,L->top + -(long)nres,nres);
    return 1;
  }
  __assert_fail("((n) < (L->top - L->ci->func)) && \"not enough elements in the stack\"",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                ,0x1c7,"int luaD_precall(lua_State *, StkId, int, int)");
}

Assistant:

int luaD_precall (lua_State *L, StkId func, int nresults, int op_call) {
  lua_CFunction f;
  CallInfo *ci;
  switch (ttype(func)) {
    case LUA_TCCL:  /* C closure */
      f = clCvalue(func)->f;
      goto Cfunc;
    case LUA_TLCF:  /* light C function */
      f = fvalue(func);
     Cfunc: {
      int n;  /* number of returns */
      checkstackp(L, LUA_MINSTACK, func);  /* ensure minimum stack size */
      ci = next_ci(L);  /* now 'enter' new function */
      ci->nresults = nresults;
      ci->func = func;
      ci->top = L->top + LUA_MINSTACK;
      lua_assert(ci->top <= L->stack_last);
      ci->callstatus = 0;
      ci->jitstatus = 0;
      if (L->hookmask & LUA_MASKCALL)
        luaD_hook(L, LUA_HOOKCALL, -1);
      lua_unlock(L);
      n = (*f)(L);  /* do the actual call */
      lua_lock(L);
      api_checknelems(L, n);
      luaD_poscall(L, ci, L->top - n, n);
      return 1;
    }
    case LUA_TLCL: {  /* Lua function: prepare its call */
      StkId base;
      Proto *p = clLvalue(func)->p;
      int n = cast_int(L->top - func) - 1;  /* number of real arguments */
      int fsize = p->maxstacksize;  /* frame size */
      checkstackp(L, fsize, func);
      if (p->is_vararg)
        base = adjust_varargs(L, p, n);
      else {  /* non vararg function */
        for (; n < p->numparams; n++)
          setnilvalue(L->top++);  /* complete missing arguments */
        base = func + 1;
      }
      ci = next_ci(L);  /* now 'enter' new function */
      ci->nresults = nresults;
      ci->func = func;
      ci->u.l.base = base;
      L->top = ci->top = base + fsize;
      lua_assert(ci->top <= L->stack_last);
      ci->u.l.savedpc = p->code;  /* starting point */
      ci->callstatus = CIST_LUA;
      ci->jitstatus = 0;
      if (L->hookmask & LUA_MASKCALL)
        callhook(L, ci);
      if (L == G(L)->mainthread && p->ravi_jit.jit_status == RAVI_JIT_NOT_COMPILED) {
        /* not compiled */
        ravi_compile_options_t options;
        memset(&options, 0, sizeof options);
        raviV_compile(L, p, &options);
      }
      if (L == G(L)->mainthread && p->ravi_jit.jit_function) {
        /* compiled */
        ci->jitstatus = 1;
        /* Since the JITed function does not update savedpc
         * other than for calls by default - the stack trace error
         * message below will be unable to find the line info
         * as savedpc is not set correctly - so we set this here
         * prior to the call
         */
        ci->u.l.savedpc++;
        /* As JITed function is like a C function
         * employ the same restrictions on recursive
         * calls as for C functions
         */
        if (++L->nCcalls >= LUAI_MAXCCALLS) {
          if (L->nCcalls == LUAI_MAXCCALLS)
            luaG_runerror(L, "stack overflow");
          else if (L->nCcalls >= (LUAI_MAXCCALLS + (LUAI_MAXCCALLS >> 3)))
            luaD_throw(L, LUA_ERRERR); /* error while handing stack error */
        }
        /* Disable YIELDs - so JITed functions cannot
         * yield
         */
        L->nny++;
        int b = (*p->ravi_jit.jit_function)(L);
        L->nny--;
        L->nCcalls--;
        if (op_call && b) {
          lua_assert(isLua(L->ci));
          /* b is the value returned by luaD_poscall()
           */
          L->top = L->ci->top;
        }
        /* Return a different value from 1 to
         * allow luaV_execute() to distinguish between
         * JITed function and true C function
         */
        return 2;
      }
      return 0;
    }
    case RAVI_TFCF: {
      int nargs = (int)(L->top - func - 1);
      int tt = rttype(func);
      int sig = getfcf_tag(tt); /* Extract the function signature */
      switch (sig) {
        case RAVI_TFCF_LOG:
        case RAVI_TFCF_EXP:
        case RAVI_TFCF_D_D: {
          if (nargs == 1) {
            TValue *arg1 = func + 1;
            double arg;
            if (ttisfloat(arg1))
              arg = fltvalue(arg1);
            else if (ttisinteger(arg1))
              arg = (double)ivalue(arg1);
            else
              nargs = 0;
            if (nargs) {
              double v;
              switch (sig) {
                case RAVI_TFCF_EXP: v = exp(arg); break;
                case RAVI_TFCF_LOG: v = log(arg); break;
                default: {
                  double(*f)(double) = fcfvalue(func);
                  v = f(arg);
                  break;
                }
              }
              setfltvalue(func, v);
              L->top = func + 1; /* top points after the last result */
              return 1;
            }
          }
          break;
        }
        default: { break; }
      }
      luaG_runerror(L, "Unsupported fastcall to C function");
    }
    default: {  /* not a function */
      checkstackp(L, 1, func);  /* ensure space for metamethod */
      tryfuncTM(L, func);  /* try to get '__call' metamethod */
      return luaD_precall(L, func, nresults, op_call);  /* now it must be a function */
    }
  }
}